

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  int iVar1;
  ServiceDescriptor *in_RDI;
  int i;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  int index;
  
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = FileDescriptor::service_count(*(FileDescriptor **)(in_RDI + 0x30));
    if (iVar1 <= iVar2) break;
    FileDescriptor::service(*(FileDescriptor **)(in_RDI + 0x30),index);
    PrintServiceClass((Generator *)CONCAT44(index,in_stack_fffffffffffffff0),in_RDI);
    FileDescriptor::service(*(FileDescriptor **)(in_RDI + 0x30),index);
    PrintServiceStub((Generator *)CONCAT44(index,in_stack_fffffffffffffff0),in_RDI);
    io::Printer::Print<>(in_stack_00000030,in_stack_00000028);
    iVar2 = index + 1;
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}